

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O3

Equatorial * __thiscall
icu_63::CalendarAstronomer::eclipticToEquatorial
          (CalendarAstronomer *this,Equatorial *result,double eclipLong,double eclipLat)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar1 = eclipticObliquity(this);
  dVar2 = sin(dVar1);
  dVar1 = cos(dVar1);
  dVar3 = sin(eclipLong);
  dVar4 = cos(eclipLong);
  dVar5 = sin(eclipLat);
  dVar6 = cos(eclipLat);
  dVar7 = tan(eclipLat);
  dVar4 = atan2(dVar3 * dVar1 - dVar7 * dVar2,dVar4);
  dVar1 = asin(dVar5 * dVar1 + dVar6 * dVar2 * dVar3);
  result->ascension = dVar4;
  result->declination = dVar1;
  return result;
}

Assistant:

CalendarAstronomer::Equatorial& CalendarAstronomer::eclipticToEquatorial(CalendarAstronomer::Equatorial& result, double eclipLong, double eclipLat)
{
    // See page 42 of "Practial Astronomy with your Calculator",
    // by Peter Duffet-Smith, for details on the algorithm.

    double obliq = eclipticObliquity();
    double sinE = ::sin(obliq);
    double cosE = cos(obliq);

    double sinL = ::sin(eclipLong);
    double cosL = cos(eclipLong);

    double sinB = ::sin(eclipLat);
    double cosB = cos(eclipLat);
    double tanB = tan(eclipLat);

    result.set(atan2(sinL*cosE - tanB*sinE, cosL),
        asin(sinB*cosE + cosB*sinE*sinL) );
    return result;
}